

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int rtosc_print_range(rtosc_arg_val_t *arg,char *buffer,size_t bs,rtosc_print_options *opt,
                     int *cols_used,rtosc_arg_val_t *prev_arg)

{
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  rtosc_arg_t *arg_00;
  rtosc_arg_val_t *arg_01;
  size_t sVar5;
  char *pcVar6;
  rtosc_print_options *in_RCX;
  long lVar7;
  size_t *in_RDX;
  char *in_RSI;
  long in_RDI;
  int *in_R8;
  char *in_R9;
  int _n1_6;
  size_t tmp_2;
  rtosc_arg_val_t *cur;
  rtosc_arg_val_t tmparg;
  int i;
  int args_written_this_line;
  char *last_sep;
  int _n1_5;
  int _n1_4;
  int _n2_2;
  int tmp_1;
  int _n1_3;
  int _n2_1;
  int _n1_2;
  rtosc_arg_val_t second;
  int _n1_1;
  int _n2;
  int confusing_prev_arg;
  rtosc_arg_val_t m_one;
  rtosc_arg_val_t one;
  int _n1;
  int tmp;
  rtosc_arg_val_t *first_arg;
  rtosc_arg_t *val;
  int start;
  size_t wrt;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  size_t *in_stack_fffffffffffffed8;
  int32_t in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  size_t in_stack_fffffffffffffef8;
  int ith;
  rtosc_arg_val_t *in_stack_ffffffffffffff00;
  rtosc_arg_val_t *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int local_e0;
  uint local_dc;
  char *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  int local_b4;
  rtosc_arg_val_t local_b0;
  undefined4 local_94;
  undefined4 local_90;
  uint local_8c;
  rtosc_arg_val_t local_88;
  int local_3c;
  size_t *local_18;
  char *local_10;
  
  iVar4 = 0;
  arg_00 = (rtosc_arg_t *)(in_RDI + 8);
  if ((in_RCX->compress_ranges == 0) && (iVar1 = rtosc_arg_rep_num(arg_00), iVar1 != 0)) {
    local_3c = 0;
    local_18 = in_RDX;
    local_10 = in_RSI;
  }
  else {
    iVar1 = rtosc_arg_rep_has_delta(arg_00);
    if ((iVar1 == 0) && (iVar1 = rtosc_arg_rep_num(arg_00), iVar1 != 0)) {
      in_stack_fffffffffffffed0 = in_RSI;
      in_stack_fffffffffffffed8 = in_RDX;
      uVar3 = rtosc_arg_rep_num(arg_00);
      iVar4 = asnprintf(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffed8,"%dx",
                        (ulong)uVar3);
      *in_R8 = iVar4 + *in_R8;
      local_c8 = iVar4;
      local_c4 = iVar4;
      local_c0 = iVar4;
      sVar5 = rtosc_print_arg_val((rtosc_arg_val_t *)(in_RDI + 0x18),in_RSI + iVar4,
                                  (long)in_RDX - (long)iVar4,in_RCX,in_R8,(rtosc_arg_val_t *)0x0);
      local_cc = (int)sVar5;
      local_18 = (size_t *)(((long)in_RDX - (long)iVar4) - (long)local_cc);
      local_10 = in_RSI + iVar4 + local_cc;
      iVar4 = local_cc + iVar4;
      local_c0 = local_cc;
      local_3c = rtosc_arg_rep_num(arg_00);
    }
    else {
      iVar1 = rtosc_arg_rep_has_delta(arg_00);
      arg_01 = (rtosc_arg_val_t *)(in_RDI + 0x18 + (long)(int)(uint)(iVar1 != 0) * 0x18);
      sVar5 = rtosc_print_arg_val(arg_01,in_RSI,(size_t)in_RDX,in_RCX,in_R8,(rtosc_arg_val_t *)0x0);
      iVar4 = (int)sVar5;
      local_18 = (size_t *)((long)in_RDX - (long)iVar4);
      local_10 = in_RSI + iVar4;
      iVar1 = rtosc_arg_rep_has_delta(arg_00);
      if (iVar1 != 0) {
        rtosc_arg_val_from_int((rtosc_arg_val_t *)&stack0xffffffffffffff90,arg_01->type,1);
        rtosc_arg_val_from_int(&local_88,arg_01->type,-1);
        local_8c = 0;
        if (in_R9 != (char *)0x0) {
          in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 & 0xffffff;
          if (*in_R9 == arg_01->type) {
            iVar2 = rtosc_arg_vals_eq_single
                              ((rtosc_arg_val_t *)in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff08,
                               (rtosc_cmp_options *)in_stack_ffffffffffffff00);
            in_stack_fffffffffffffee4 =
                 CONCAT13(iVar2 != 0,(int3)in_stack_fffffffffffffee4) ^ 0xff000000;
          }
          local_8c = (uint)((byte)(in_stack_fffffffffffffee4 >> 0x18) & 1);
        }
        iVar2 = rtosc_arg_vals_eq_single
                          ((rtosc_arg_val_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                           (rtosc_cmp_options *)in_stack_ffffffffffffff00);
        if ((((iVar2 == 0) &&
             (iVar2 = rtosc_arg_vals_eq_single
                                ((rtosc_arg_val_t *)in_stack_ffffffffffffff10,
                                 in_stack_ffffffffffffff08,
                                 (rtosc_cmp_options *)in_stack_ffffffffffffff00), iVar2 == 0)) ||
            (local_8c != 0)) && (iVar1 = rtosc_arg_rep_num(arg_00), iVar1 != 0)) {
          asnprintf(local_10,(size_t)local_18," ");
          local_90 = 1;
          local_94 = 1;
          *in_R8 = *in_R8 + 1;
          rtosc_arg_val_range_arg
                    (in_stack_ffffffffffffff00,(int)(in_stack_fffffffffffffef8 >> 0x20),
                     (rtosc_arg_val_t *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          sVar5 = rtosc_print_arg_val(&local_b0,local_10 + 1,(long)local_18 - 1U,in_RCX,in_R8,
                                      (rtosc_arg_val_t *)0x0);
          local_b4 = (int)sVar5;
          local_18 = (size_t *)(((long)local_18 - 1U) - (long)local_b4);
          local_10 = local_10 + 1 + local_b4;
          iVar4 = local_b4 + iVar4 + 1;
        }
      }
      asnprintf(local_10,(size_t)local_18," ... ");
      local_b8 = 5;
      local_bc = 5;
      local_18 = (size_t *)((long)local_18 - 5);
      local_10 = local_10 + 5;
      iVar4 = iVar4 + 5;
      *in_R8 = *in_R8 + 5;
      in_stack_fffffffffffffee0 = rtosc_arg_rep_num(arg_00);
      iVar1 = rtosc_arg_rep_num(arg_00);
      local_3c = in_stack_fffffffffffffee0 - (uint)(iVar1 != 0);
    }
  }
  local_dc = (uint)(in_R8 != (int *)0x0);
  local_e0 = local_3c;
  local_d8 = local_10 + -1;
  while( true ) {
    ith = (int)(in_stack_fffffffffffffef8 >> 0x20);
    iVar2 = local_e0;
    iVar1 = rtosc_arg_rep_num(arg_00);
    if (iVar1 <= iVar2) break;
    iVar1 = rtosc_arg_rep_has_delta(arg_00);
    if (iVar1 == 0) {
      in_stack_ffffffffffffff00 = (rtosc_arg_val_t *)(in_RDI + 0x18);
    }
    else {
      rtosc_arg_val_range_arg
                (in_stack_ffffffffffffff00,ith,
                 (rtosc_arg_val_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      in_stack_ffffffffffffff00 = (rtosc_arg_val_t *)&stack0xffffffffffffff08;
    }
    in_stack_fffffffffffffef8 =
         rtosc_print_arg_val(in_stack_ffffffffffffff00,local_10,(size_t)local_18,in_RCX,in_R8,
                             (rtosc_arg_val_t *)0x0);
    in_stack_fffffffffffffef4 = (int)in_stack_fffffffffffffef8;
    lVar7 = (long)in_stack_fffffffffffffef4;
    pcVar6 = local_10 + in_stack_fffffffffffffef4;
    iVar4 = in_stack_fffffffffffffef4 + iVar4;
    linebreak_check_after_write
              ((int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (char **)CONCAT44(iVar2,in_stack_fffffffffffffec8),
               (size_t *)CONCAT44(in_stack_fffffffffffffec4,in_RCX->linelength),(size_t)&local_dc,
               (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffef4);
    local_10 = pcVar6 + 1;
    *pcVar6 = ' ';
    local_18 = (size_t *)((long)local_18 + (-1 - lVar7));
    iVar4 = iVar4 + 1;
    *in_R8 = *in_R8 + 1;
    local_e0 = local_e0 + 1;
    local_d8 = pcVar6;
  }
  iVar1 = rtosc_arg_rep_num(arg_00);
  if (local_3c < iVar1) {
    local_10[-1] = '\0';
    iVar4 = iVar4 + -1;
  }
  return iVar4;
}

Assistant:

static int rtosc_print_range(const rtosc_arg_val_t* arg,
                             char* buffer, size_t bs,
                             const rtosc_print_options* opt, int* cols_used,
                             const rtosc_arg_val_t* prev_arg)
{
    size_t wrt = 0;
    int start;
    const rtosc_arg_t* val = &arg->val;

    // prepare for the loop
    if(opt->compress_ranges || !rtosc_arg_rep_num(val))
    {
        if(rtosc_arg_rep_has_delta(val) || !rtosc_arg_rep_num(val))
        {
            // delta or endless range (endless has no delta)

            const rtosc_arg_val_t* first_arg = arg+1+!!rtosc_arg_rep_has_delta(val);
            int tmp = rtosc_print_arg_val(first_arg, buffer, bs,
                                          opt, cols_used, NULL);
            COUNT_UP(tmp);

            if(rtosc_arg_rep_has_delta(val))
            {
                rtosc_arg_val_t one, m_one;
                rtosc_arg_val_from_int(  &one, first_arg->type,  1);
                rtosc_arg_val_from_int(&m_one, first_arg->type, -1);
                int confusing_prev_arg = false;
                if(prev_arg)
                {
                    confusing_prev_arg =
                            (prev_arg->type == first_arg->type) &&
                            !rtosc_arg_vals_eq_single(first_arg, prev_arg, NULL);
                }
                if(((   rtosc_arg_vals_eq_single(arg+1,   &one, NULL)
                    || rtosc_arg_vals_eq_single(arg+1, &m_one, NULL))
                   && !confusing_prev_arg)
                   || !rtosc_arg_rep_num(val)) // infinite => special, weird case
                {
                    // for -1 and +1, no second number is needed
                    // however, this only works if
                    // there was no confusing previous arg (that would imply
                    // a step size other than +-1)
                }
                else
                {
                    asnprintf(buffer, bs, " ");
                    COUNT_UP_COL(1);

                    rtosc_arg_val_t second;
                    rtosc_arg_val_range_arg(arg, 1, &second);
                    tmp = rtosc_print_arg_val(&second, buffer, bs,
                                              opt, cols_used, NULL);
                    COUNT_UP(tmp);
                }
            }

            asnprintf(buffer, bs, " ... ");
            COUNT_UP_COL(5);

            // print only the last value
            // (or nothing if the range is infinite)
            start = rtosc_arg_rep_num(val) - (!!rtosc_arg_rep_num(val));
        }
        else
        {
            int tmp;
            // print "nx..."
            tmp = asnprintf(buffer, bs, "%dx", rtosc_arg_rep_num(val));
            COUNT_UP_COL(tmp);
            tmp = rtosc_print_arg_val(arg+1, buffer, bs,
                                      opt, cols_used, NULL);
            COUNT_UP(tmp);

            // skip loop below
            start = rtosc_arg_rep_num(val);
        }

    }
    else {
            start = 0; // print the whole range
    }

    // loop over all args of the range
    char* last_sep = buffer - 1;
    int args_written_this_line = (cols_used) ? 1 : 0;

    for(int i = start; i < rtosc_arg_rep_num(val); ++i)
    {
        rtosc_arg_val_t tmparg;
        const rtosc_arg_val_t *cur;
        if(rtosc_arg_rep_has_delta(val))
        {
            rtosc_arg_val_range_arg(arg, i, &tmparg);
            cur = &tmparg;
        }
        else
            cur = arg + 1;

        size_t tmp = rtosc_print_arg_val(cur, buffer, bs,
                                         opt, cols_used, NULL);
        COUNT_UP(tmp);

        linebreak_check_after_write(cols_used, &wrt,
                                    last_sep, &buffer, &bs,
                                    tmp, &args_written_this_line,
                                    opt->linelength);

        last_sep = buffer;
        COUNT_UP_WRITE(' ');
    }

    if(start < rtosc_arg_rep_num(val)) {
        // => remove last separator, that we have written too much
        buffer[-1] = 0;
        --wrt; // we have overridden space with '\0', and '\0' doesn't count
    }

    return wrt;
}